

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

int xmlSBufGrow(xmlSBuf *buf,uint len)

{
  uint uVar1;
  int iVar2;
  xmlChar *pxVar3;
  uint uVar4;
  
  if (len < (buf->size ^ 0x7fffffff)) {
    uVar1 = (buf->size + len) * 2;
    uVar4 = 0xf0;
    if (0xf0 < uVar1) {
      uVar4 = uVar1;
    }
    pxVar3 = (xmlChar *)(*xmlRealloc)(buf->mem,(size_t)uVar4);
    if (pxVar3 == (xmlChar *)0x0) {
      buf->code = XML_ERR_NO_MEMORY;
      iVar2 = -1;
    }
    else {
      buf->mem = pxVar3;
      buf->cap = uVar4;
      iVar2 = 0;
    }
  }
  else {
    iVar2 = -1;
    if (buf->code == XML_ERR_OK) {
      buf->code = XML_ERR_RESOURCE_LIMIT;
    }
  }
  return iVar2;
}

Assistant:

static int
xmlSBufGrow(xmlSBuf *buf, unsigned len) {
    xmlChar *mem;
    unsigned cap;

    if (len >= UINT_MAX / 2 - buf->size) {
        if (buf->code == XML_ERR_OK)
            buf->code = XML_ERR_RESOURCE_LIMIT;
        return(-1);
    }

    cap = (buf->size + len) * 2;
    if (cap < 240)
        cap = 240;

    mem = xmlRealloc(buf->mem, cap);
    if (mem == NULL) {
        buf->code = XML_ERR_NO_MEMORY;
        return(-1);
    }

    buf->mem = mem;
    buf->cap = cap;

    return(0);
}